

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

opj_bool j2k_read_mct(opj_j2k_v2_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                     opj_event_mgr *p_manager)

{
  uint uVar1;
  opj_mct_data_t *poVar2;
  OPJ_BYTE *pOVar3;
  ulong uVar4;
  char *fmt;
  opj_bool oVar5;
  ulong uVar6;
  opj_mct_data_t *poVar7;
  uint uVar8;
  opj_tcp_v2_t *poVar9;
  uint uVar10;
  bool bVar11;
  OPJ_UINT32 l_tmp;
  OPJ_BYTE *local_40;
  opj_mct_data_t *local_38;
  
  if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
    poVar9 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
  }
  else {
    poVar9 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
  }
  if (p_header_size < 2) {
LAB_001df0e5:
    oVar5 = 0;
    opj_event_msg_v2(p_manager,1,"Error reading MCT marker\n");
  }
  else {
    opj_read_bytes_LE(p_header_data,&l_tmp,2);
    if (l_tmp == 0) {
      if (p_header_size < 7) goto LAB_001df0e5;
      opj_read_bytes_LE(p_header_data + 2,&l_tmp,2);
      pOVar3 = p_header_data + 4;
      poVar2 = poVar9->m_mct_records;
      uVar10 = poVar9->m_nb_mct_records;
      uVar6 = (ulong)uVar10;
      uVar4 = uVar6;
      poVar7 = poVar2;
      uVar1 = uVar10;
      while( true ) {
        bVar11 = uVar1 == 0;
        uVar1 = uVar1 - 1;
        uVar8 = l_tmp & 0xff;
        if (bVar11) break;
        if (poVar7->m_index == uVar8) {
          if ((int)uVar4 != 0) goto LAB_001df200;
          break;
        }
        poVar7 = poVar7 + 1;
        uVar4 = (ulong)uVar1;
      }
      if (uVar10 == poVar9->m_nb_max_mct_records) {
        poVar9->m_nb_max_mct_records = uVar10 + 10;
        local_40 = pOVar3;
        poVar2 = (opj_mct_data_t *)realloc(poVar2,(ulong)(uVar10 + 10) << 5);
        poVar9->m_mct_records = poVar2;
        if (poVar2 == (opj_mct_data_t *)0x0) goto LAB_001df0e5;
        uVar6 = (ulong)poVar9->m_nb_mct_records;
        local_38 = poVar2;
        memset(poVar2 + uVar6,0,
               (ulong)(poVar9->m_nb_max_mct_records - poVar9->m_nb_mct_records) << 5);
        poVar2 = local_38;
        pOVar3 = local_40;
      }
      poVar7 = poVar2 + uVar6;
LAB_001df200:
      if (poVar7->m_data != (OPJ_BYTE *)0x0) {
        local_40 = pOVar3;
        free(poVar7->m_data);
        poVar7->m_data = (OPJ_BYTE *)0x0;
        pOVar3 = local_40;
      }
      poVar7->m_index = uVar8;
      poVar7->m_array_type = l_tmp >> 8 & (MCT_TYPE_OFFSET|MCT_TYPE_DECORRELATION);
      poVar7->m_element_type = l_tmp >> 10 & MCT_TYPE_DOUBLE;
      opj_read_bytes_LE(pOVar3,&l_tmp,2);
      if (l_tmp != 0) {
        fmt = "Cannot take in charge multiple MCT markers\n";
        goto LAB_001df11e;
      }
      uVar10 = p_header_size - 6;
      pOVar3 = (OPJ_BYTE *)malloc((ulong)uVar10);
      poVar7->m_data = pOVar3;
      if (pOVar3 == (OPJ_BYTE *)0x0) goto LAB_001df0e5;
      memcpy(pOVar3,p_header_data + 6,(ulong)uVar10);
      poVar7->m_data_size = uVar10;
      poVar9->m_nb_mct_records = poVar9->m_nb_mct_records + 1;
    }
    else {
      fmt = "Cannot take in charge mct data within multiple MCT records\n";
LAB_001df11e:
      opj_event_msg_v2(p_manager,2,fmt);
    }
    oVar5 = 1;
  }
  return oVar5;
}

Assistant:

opj_bool j2k_read_mct (	opj_j2k_v2_t *p_j2k,
						OPJ_BYTE * p_header_data,
						OPJ_UINT32 p_header_size,
						struct opj_event_mgr * p_manager )
{
	OPJ_UINT32 i;
	opj_tcp_v2_t *l_tcp = 00;
	OPJ_UINT32 l_tmp;
	OPJ_UINT32 l_indix;
	opj_mct_data_t * l_mct_data;

	/* preconditions */
	assert(p_header_data != 00);
	assert(p_j2k != 00);

	l_tcp = p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH ?
			&p_j2k->m_cp.tcps[p_j2k->m_current_tile_number] :
			p_j2k->m_specific_param.m_decoder.m_default_tcp;

	if (p_header_size < 2) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading MCT marker\n");
		return OPJ_FALSE;
	}

	/* first marker */
	opj_read_bytes(p_header_data,&l_tmp,2);				/* Zmct */
	p_header_data += 2;
	if (l_tmp != 0) {
		opj_event_msg_v2(p_manager, EVT_WARNING, "Cannot take in charge mct data within multiple MCT records\n");
		return OPJ_TRUE;
	}

	if(p_header_size <= 6) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading MCT marker\n");
		return OPJ_FALSE;
	}

	/* Imct -> no need for other values, take the first, type is double with decorrelation x0000 1101 0000 0000*/
	opj_read_bytes(p_header_data,&l_tmp,2); 			/* Imct */
	p_header_data += 2;

	l_indix = l_tmp & 0xff;
	l_mct_data = l_tcp->m_mct_records;

	for (i=0;i<l_tcp->m_nb_mct_records;++i) {
		if (l_mct_data->m_index == l_indix) {
			break;
		}
		++l_mct_data;
	}

	/* NOT FOUND */
	if (i == l_tcp->m_nb_mct_records) {
		if (l_tcp->m_nb_mct_records == l_tcp->m_nb_max_mct_records) {
			l_tcp->m_nb_max_mct_records += J2K_MCT_DEFAULT_NB_RECORDS;

			l_tcp->m_mct_records = (opj_mct_data_t*)opj_realloc(l_tcp->m_mct_records,l_tcp->m_nb_max_mct_records * sizeof(opj_mct_data_t));
			if(! l_tcp->m_mct_records) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading MCT marker\n");
				return OPJ_FALSE;
			}

			l_mct_data = l_tcp->m_mct_records + l_tcp->m_nb_mct_records;
			memset(l_mct_data ,0,(l_tcp->m_nb_max_mct_records - l_tcp->m_nb_mct_records) * sizeof(opj_mct_data_t));
		}

		l_mct_data = l_tcp->m_mct_records + l_tcp->m_nb_mct_records;
	}

	if (l_mct_data->m_data) {
		opj_free(l_mct_data->m_data);
		l_mct_data->m_data = 00;
	}

	l_mct_data->m_index = l_indix;
	l_mct_data->m_array_type = (J2K_MCT_ARRAY_TYPE)((l_tmp  >> 8) & 3);
	l_mct_data->m_element_type = (J2K_MCT_ELEMENT_TYPE)((l_tmp  >> 10) & 3);

	opj_read_bytes(p_header_data,&l_tmp,2);				/* Ymct */
	p_header_data+=2;
	if (l_tmp != 0) {
		opj_event_msg_v2(p_manager, EVT_WARNING, "Cannot take in charge multiple MCT markers\n");
		return OPJ_TRUE;
	}

	p_header_size -= 6;

	l_mct_data->m_data = (OPJ_BYTE*)opj_malloc(p_header_size);
	if (! l_mct_data->m_data) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading MCT marker\n");
		return OPJ_FALSE;
	}
	memcpy(l_mct_data->m_data,p_header_data,p_header_size);

	l_mct_data->m_data_size = p_header_size;
	++l_tcp->m_nb_mct_records;

	return OPJ_TRUE;
}